

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O3

void __thiscall QEvdevTabletHandler::~QEvdevTabletHandler(QEvdevTabletHandler *this)

{
  int __fd;
  QEvdevTabletData *pQVar1;
  Data *pDVar2;
  int iVar3;
  int *piVar4;
  
  *(undefined ***)this = &PTR_metaObject_0010d5f8;
  __fd = this->m_fd;
  if (-1 < __fd) {
    do {
      iVar3 = close(__fd);
      if (iVar3 != -1) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
  }
  pQVar1 = this->d;
  if ((pQVar1 != (QEvdevTabletData *)0x0) && (pDVar2 = (pQVar1->devName).d.d, pDVar2 != (Data *)0x0)
     ) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((pQVar1->devName).d.d)->super_QArrayData,2,0x10);
    }
  }
  operator_delete(pQVar1,0x78);
  pDVar2 = (this->m_device).d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_device).d.d)->super_QArrayData,2,0x10);
    }
  }
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QEvdevTabletHandler::~QEvdevTabletHandler()
{
    if (m_fd >= 0)
        QT_CLOSE(m_fd);

    delete d;
}